

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O2

void SelectBaseParams(ChainType chain)

{
  _Alloc_hider __p;
  long in_FS_OFFSET;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CreateBaseChainParams((ChainType)&local_38);
  __p._M_p = local_38._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::reset
            ((__uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_> *)
             &globalChainBaseParams,(pointer)__p._M_p);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr
            ((unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> *)&local_38);
  ChainTypeToString_abi_cxx11_(&local_38,chain);
  ArgsManager::SelectConfigNetwork(&gArgs,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectBaseParams(const ChainType chain)
{
    globalChainBaseParams = CreateBaseChainParams(chain);
    gArgs.SelectConfigNetwork(ChainTypeToString(chain));
}